

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall draco::CornerTable::ComputeVertexCorners(CornerTable *this,int num_vertices)

{
  uint uVar1;
  iterator __position;
  iterator __position_00;
  pointer pIVar2;
  pointer pIVar3;
  bool bVar4;
  _Bit_type *p_Var5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pIVar10;
  undefined4 in_register_00000034;
  ulong *puVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  pointer pIVar18;
  VertexIndex v;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_b0;
  allocator_type local_a9;
  ulong local_a8;
  vector<bool,_std::allocator<bool>_> local_a0;
  ulong local_78;
  vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
  *local_70;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_68;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_a8 = CONCAT44(in_register_00000034,num_vertices);
  this->num_original_vertices_ = num_vertices;
  local_68 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->vertex_corners_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::resize((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)local_68,(long)num_vertices,(value_type *)&kInvalidCornerIndex);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a0,(long)num_vertices,(bool *)&local_58,(allocator_type *)&local_b0);
  local_b0.value_ = local_b0.value_ & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (bool *)&local_b0,&local_a9);
  pIVar10 = (this->corner_to_vertex_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar18 = (this->corner_to_vertex_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pIVar18 - (long)pIVar10 >> 2) / 3) != 0) {
    local_70 = (vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
                *)&this->non_manifold_vertex_parents_;
    uVar14 = 0;
    do {
      bVar4 = IsDegenerated(this,(FaceIndex)(uint)uVar14);
      if (!bVar4) {
        uVar8 = (ulong)((uint)uVar14 * 3);
        lVar15 = 0;
        p_Var5 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        local_78 = uVar14;
        local_60 = uVar8;
        do {
          uVar17 = (int)uVar8 + (int)lVar15;
          if ((p_Var5[uVar17 >> 6] >> ((ulong)uVar17 & 0x3f) & 1) == 0) {
            local_b0.value_ = pIVar10[uVar17].value_;
            uVar16 = 1L << ((byte)local_b0.value_ & 0x3f);
            uVar9 = (ulong)(local_b0.value_ >> 6);
            uVar14 = local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9];
            uVar8 = uVar16;
            if ((uVar14 >> ((ulong)local_b0.value_ & 0x3f) & 1) != 0) {
              __position._M_current =
                   (this->vertex_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->vertex_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          (local_68,__position,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                           &kInvalidCornerIndex);
              }
              else {
                (__position._M_current)->value_ = 0xffffffff;
                (this->vertex_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              __position_00._M_current =
                   (this->non_manifold_vertex_parents_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (this->non_manifold_vertex_parents_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>const&>
                          (local_70,__position_00,&local_b0);
              }
              else {
                (__position_00._M_current)->value_ = local_b0.value_;
                (this->non_manifold_vertex_parents_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_a0,false);
              local_b0.value_ = (uint)local_a8;
              uVar9 = local_a8 >> 6 & 0x3ffffff;
              bVar6 = (byte)local_a8;
              local_a8 = (ulong)(local_b0.value_ + 1);
              uVar8 = 1L << (bVar6 & 0x3f);
            }
            local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar9] =
                 local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9] | uVar8;
            pIVar2 = (this->vertex_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pIVar10 = (this->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pIVar3 = (this->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = uVar17;
            do {
              p_Var5 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar8 = local_60;
              if (uVar7 == 0xffffffff) {
                if (uVar17 == 0xffffffff) break;
                if (uVar17 * -0x55555555 < 0x55555556) {
                  uVar17 = uVar17 + 2;
                  if (uVar17 == 0xffffffff) break;
                }
                else {
                  uVar17 = uVar17 - 1;
                }
                uVar17 = pIVar3[uVar17].value_;
                if (uVar17 == 0xffffffff) break;
                if (uVar17 * -0x55555555 < 0x55555556) {
                  uVar17 = uVar17 + 2;
                  if (uVar17 == 0xffffffff) break;
                }
                else {
                  uVar17 = uVar17 - 1;
                }
                pIVar10 = (this->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pIVar2 = (this->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00131a8d;
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] |
                   1L << ((byte)uVar7 & 0x3f);
              pIVar2[local_b0.value_].value_ = uVar7;
              if ((uVar16 & uVar14) != 0) {
                pIVar10[uVar7].value_ = local_b0.value_;
              }
              uVar1 = uVar7 - 2;
              if (0x55555555 < (uVar7 + 1) * -0x55555555) {
                uVar1 = uVar7 + 1;
              }
              uVar7 = 0xffffffff;
              if ((uVar1 != 0xffffffff) && (uVar1 = pIVar3[uVar1].value_, uVar1 != 0xffffffff)) {
                uVar7 = uVar1 - 2;
                if (0x55555555 < (uVar1 + 1) * -0x55555555) {
                  uVar7 = uVar1 + 1;
                }
              }
            } while (uVar7 != uVar17);
          }
LAB_00131af4:
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        pIVar10 = (this->corner_to_vertex_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar18 = (this->corner_to_vertex_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar14 = local_78;
      }
      uVar17 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar17;
    } while (uVar17 < (uint)((ulong)((long)pIVar18 - (long)pIVar10 >> 2) / 3));
  }
  this->num_isolated_vertices_ = 0;
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    uVar14 = 0;
    iVar12 = 0;
    puVar11 = local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    do {
      if ((*puVar11 >> (uVar14 & 0x3f) & 1) == 0) {
        iVar12 = iVar12 + 1;
        this->num_isolated_vertices_ = iVar12;
      }
      iVar13 = (int)uVar14;
      puVar11 = puVar11 + (iVar13 == 0x3f);
      uVar14 = (ulong)(iVar13 + 1);
      if (iVar13 == 0x3f) {
        uVar14 = 0;
      }
    } while ((uint)uVar14 !=
             local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar11 !=
             local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return true;
LAB_00131a8d:
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p[uVar17 >> 6] =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p[uVar17 >> 6] | 1L << ((byte)uVar17 & 0x3f);
  if ((uVar16 & uVar14) != 0) {
    pIVar10[uVar17].value_ = local_b0.value_;
  }
  if (uVar17 * -0x55555555 < 0x55555556) {
    uVar17 = uVar17 + 2;
    if (uVar17 == 0xffffffff) goto LAB_00131af4;
  }
  else {
    uVar17 = uVar17 - 1;
  }
  uVar17 = pIVar2[uVar17].value_;
  if ((uVar17 == 0xffffffff) ||
     (uVar17 = ((uVar17 * -0x55555555 < 0x55555556) - 1 | 2) + uVar17, uVar17 == 0xffffffff))
  goto LAB_00131af4;
  goto LAB_00131a8d;
}

Assistant:

bool CornerTable::ComputeVertexCorners(int num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  num_original_vertices_ = num_vertices;
  vertex_corners_.resize(num_vertices, kInvalidCornerIndex);
  // Arrays for marking visited vertices and corners that allow us to detect
  // non-manifold vertices.
  std::vector<bool> visited_vertices(num_vertices, false);
  std::vector<bool> visited_corners(num_corners(), false);

  for (FaceIndex f(0); f < num_faces(); ++f) {
    const CornerIndex first_face_corner = FirstCorner(f);
    // Check whether the face is degenerated. If so ignore it.
    if (IsDegenerated(f)) {
      continue;
    }

    for (int k = 0; k < 3; ++k) {
      const CornerIndex c = first_face_corner + k;
      if (visited_corners[c.value()]) {
        continue;
      }
      VertexIndex v = corner_to_vertex_map_[c];
      // Note that one vertex maps to many corners, but we just keep track
      // of the vertex which has a boundary on the left if the vertex lies on
      // the boundary. This means that all the related corners can be accessed
      // by iterating over the SwingRight() operator.
      // In case of a vertex inside the mesh, the choice is arbitrary.
      bool is_non_manifold_vertex = false;
      if (visited_vertices[v.value()]) {
        // A visited vertex of an unvisited corner found. Must be a non-manifold
        // vertex.
        // Create a new vertex for it.
        vertex_corners_.push_back(kInvalidCornerIndex);
        non_manifold_vertex_parents_.push_back(v);
        visited_vertices.push_back(false);
        v = VertexIndex(num_vertices++);
        is_non_manifold_vertex = true;
      }
      // Mark the vertex as visited.
      visited_vertices[v.value()] = true;

      // First swing all the way to the left and mark all corners on the way.
      CornerIndex act_c(c);
      while (act_c != kInvalidCornerIndex) {
        visited_corners[act_c.value()] = true;
        // Vertex will eventually point to the left most corner.
        vertex_corners_[v] = act_c;
        if (is_non_manifold_vertex) {
          // Update vertex index in the corresponding face.
          corner_to_vertex_map_[act_c] = v;
        }
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          break;  // Full circle reached.
        }
      }
      if (act_c == kInvalidCornerIndex) {
        // If we have reached an open boundary we need to swing right from the
        // initial corner to mark all corners in the opposite direction.
        act_c = SwingRight(c);
        while (act_c != kInvalidCornerIndex) {
          visited_corners[act_c.value()] = true;
          if (is_non_manifold_vertex) {
            // Update vertex index in the corresponding face.
            corner_to_vertex_map_[act_c] = v;
          }
          act_c = SwingRight(act_c);
        }
      }
    }
  }

  // Count the number of isolated (unprocessed) vertices.
  num_isolated_vertices_ = 0;
  for (bool visited : visited_vertices) {
    if (!visited) {
      ++num_isolated_vertices_;
    }
  }
  return true;
}